

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cw-out.c
# Opt level: O3

CURLcode cw_out_flush(Curl_easy *data,_Bool unpause,_Bool flush_all)

{
  CURLcode CVar1;
  cw_out_ctx *ctx_00;
  byte flush_all_00;
  cw_out_ctx *ctx;
  
  ctx_00 = (cw_out_ctx *)Curl_cwriter_get_by_type(data,&Curl_cwt_out);
  if (ctx_00 != (cw_out_ctx *)0x0) {
    flush_all_00 = ctx_00->field_0x28;
    if ((flush_all_00 & 2) != 0) {
      return CURLE_WRITE_ERROR;
    }
    if (unpause && (flush_all_00 & 1) != 0) {
      flush_all_00 = flush_all_00 & 0xfc;
      ctx_00->field_0x28 = flush_all_00;
    }
    if ((flush_all_00 & 1) == 0) {
      CVar1 = cw_out_flush_chain(ctx_00,data,&ctx_00->buf,(_Bool)flush_all_00);
      if (CVar1 == CURLE_OK) {
        return CURLE_OK;
      }
      ctx_00->field_0x28 = ctx_00->field_0x28 | 2;
      cw_out_bufs_free(ctx_00);
      return CVar1;
    }
  }
  return CURLE_OK;
}

Assistant:

static CURLcode cw_out_flush(struct Curl_easy *data,
                             bool unpause, bool flush_all)
{
  struct Curl_cwriter *cw_out;
  CURLcode result = CURLE_OK;

  cw_out = Curl_cwriter_get_by_type(data, &Curl_cwt_out);
  if(cw_out) {
    struct cw_out_ctx *ctx = (struct cw_out_ctx *)cw_out;
    if(ctx->errored)
      return CURLE_WRITE_ERROR;
    if(unpause && ctx->paused)
      ctx->paused = FALSE;
    if(ctx->paused)
      return CURLE_OK;  /* not doing it */

    result = cw_out_flush_chain(ctx, data, &ctx->buf, flush_all);
    if(result) {
      ctx->errored = TRUE;
      cw_out_bufs_free(ctx);
      return result;
    }
  }
  return result;
}